

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headerssync.cpp
# Opt level: O0

void __thiscall HeadersSyncState::Finalize(HeadersSyncState *this)

{
  bitdeque<32768> *in_RDI;
  long in_FS_OFFSET;
  CBlockHeader *in_stack_ffffffffffffffd8;
  undefined7 in_stack_fffffffffffffff0;
  bool *val;
  
  val = *(bool **)(in_FS_OFFSET + 0x28);
  inline_assertion_check<false,bool>
            (val,(char *)CONCAT17(*(int *)((long)&in_RDI[5].m_deque.
                                                  super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                          4) != 2,in_stack_fffffffffffffff0),
             (int)((ulong)in_RDI >> 0x20),(char *)in_RDI,(char *)in_stack_ffffffffffffffd8);
  ClearShrink<bitdeque<32768>>(in_RDI);
  CBlockHeader::SetNull(in_stack_ffffffffffffffd8);
  ClearShrink<std::deque<CompressedHeader,std::allocator<CompressedHeader>>>
            ((deque<CompressedHeader,_std::allocator<CompressedHeader>_> *)in_stack_ffffffffffffffd8
            );
  base_blob<256U>::SetNull((base_blob<256U> *)in_RDI);
  base_blob<256U>::SetNull((base_blob<256U> *)in_RDI);
  *(undefined1 *)
   &in_RDI[5].m_deque.
    super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
    super__Deque_impl_data._M_start._M_node = 0;
  in_RDI[3].m_deque.super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  *(undefined4 *)
   ((long)&in_RDI[5].m_deque.
           super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl.
           super__Deque_impl_data._M_start._M_node + 4) = 2;
  if (*(bool **)(in_FS_OFFSET + 0x28) == val) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void HeadersSyncState::Finalize()
{
    Assume(m_download_state != State::FINAL);
    ClearShrink(m_header_commitments);
    m_last_header_received.SetNull();
    ClearShrink(m_redownloaded_headers);
    m_redownload_buffer_last_hash.SetNull();
    m_redownload_buffer_first_prev_hash.SetNull();
    m_process_all_remaining_headers = false;
    m_current_height = 0;

    m_download_state = State::FINAL;
}